

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O1

result_type_conflict3 * __thiscall
trng::beta_dist<long_double>::operator()
          (result_type_conflict3 *__return_storage_ptr__,beta_dist<long_double> *this,lcg64_shift *r
          )

{
  ulong uVar1;
  result_type_conflict3 *prVar2;
  
  uVar1 = *(long *)&(this->P).beta_ * *(long *)&(this->P).alpha_ +
          *(long *)((long)&(this->P).alpha_ + 8);
  *(ulong *)&(this->P).beta_ = uVar1;
  uVar1 = uVar1 >> 0x11 ^ uVar1;
  uVar1 = uVar1 << 0x1f ^ uVar1;
  prVar2 = (result_type_conflict3 *)
           math::detail::inv_Beta_I<long_double>
                     ((longdouble *)__return_storage_ptr__,
                      _DAT_002a9750 + _DAT_002a9740 * (longdouble)(uVar1 >> 1 ^ uVar1 >> 9),
                      *(longdouble *)__return_storage_ptr__,
                      *(longdouble *)(__return_storage_ptr__ + 1),
                      *(longdouble *)(__return_storage_ptr__ + 2));
  return prVar2;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return math::inv_Beta_I(utility::uniformoo<result_type>(r), P.alpha(), P.beta(),
                              P.norm());
    }